

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.h
# Opt level: O2

void __thiscall MutableS2ShapeIndex::Iterator::Refresh(Iterator *this)

{
  uint64 uVar1;
  S2ShapeIndexCell *pSVar2;
  pointer ppVar3;
  
  if (((this->iter_).node == (this->end_).node) && ((this->iter_).position == (this->end_).position)
     ) {
    (this->super_IteratorBase).id_.id_ = 0xffffffffffffffff;
    (this->super_IteratorBase).cell_._M_b._M_p = (__pointer_type)0x0;
  }
  else {
    ppVar3 = gtl::internal_btree::
             btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>,_const_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_&,_const_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_*>
             ::operator->(&this->iter_);
    uVar1 = (ppVar3->first).id_;
    ppVar3 = gtl::internal_btree::
             btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>,_const_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_&,_const_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_*>
             ::operator->(&this->iter_);
    pSVar2 = ppVar3->second;
    (this->super_IteratorBase).id_.id_ = uVar1;
    (this->super_IteratorBase).cell_._M_b._M_p = pSVar2;
  }
  return;
}

Assistant:

inline void MutableS2ShapeIndex::Iterator::Refresh() {
  if (iter_ == end_) {
    set_finished();
  } else {
    set_state(iter_->first, iter_->second);
  }
}